

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_InvalidEmpty_Test::TestBody
          (ParseCertificatePoliciesExtensionOidsTest_InvalidEmpty_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Input extension_value;
  bool bVar2;
  ParamType *pPVar3;
  char *in_R9;
  pointer *__ptr;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> policies;
  AssertionResult gtest_ar__1;
  CertErrors errors;
  string der;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  pointer local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  string local_90;
  AssertHelper local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  AssertHelper local_60;
  CertErrors local_58;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"invalid-empty.pem","");
  LoadTestData((anon_unknown_0 *)local_b8,&local_90,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b8[0] == (anon_unknown_0)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_b8,
               (AssertionResult *)"LoadTestData(\"invalid-empty.pem\", &der)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x37,local_90._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_58.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_58.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  else {
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
    local_b8 = (undefined1  [8])0x0;
    pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8 = (pointer)0x0;
    CertErrors::CertErrors(&local_58);
    extension_value.data_.size_ = local_40._M_string_length;
    extension_value.data_.data_ = (uchar *)local_40._M_dataplus._M_p;
    pPVar3 = testing::WithParamInterface<bool>::GetParam();
    bVar2 = ParseCertificatePoliciesExtensionOids
                      (extension_value,*pPVar3,
                       (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)local_b8,
                       &local_58);
    local_70.data_._0_1_ = (internal)!bVar2;
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar2) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_70,
                 (AssertionResult *)
                 "ParseCertificatePoliciesExtensionOids( StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies, &errors)"
                 ,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x3c,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_98._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    CertErrors::~CertErrors(&local_58);
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, TwoPolicies) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_and_1_2_4.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(2U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  EXPECT_EQ(der::Input(policy_1_2_4_der), policies[1]);
}